

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playmidi.cpp
# Opt level: O0

void __thiscall Timidity::Renderer::adjust_pressure(Renderer *this,int chan,int note,int amount)

{
  int iVar1;
  int local_20;
  int i;
  int amount_local;
  int note_local;
  int chan_local;
  Renderer *this_local;
  
  local_20 = this->voices;
  do {
    do {
      iVar1 = local_20 + -1;
      if (local_20 == 0) {
        return;
      }
      local_20 = iVar1;
    } while ((((this->voice[iVar1].status & 1) == 0) || ((uint)this->voice[iVar1].channel != chan))
            || ((uint)this->voice[iVar1].note != note));
    this->voice[iVar1].velocity = (BYTE)amount;
    recompute_amp(this,this->voice + iVar1);
    apply_envelope_to_amp(this->voice + iVar1);
  } while (((this->voice[iVar1].sample)->self_nonexclusive & 1U) != 0);
  return;
}

Assistant:

void Renderer::adjust_pressure(int chan, int note, int amount)
{
	int i = voices;
	while (i--)
	{
		if ((voice[i].status & VOICE_RUNNING) &&
			voice[i].channel == chan &&
			voice[i].note == note)
		{
			voice[i].velocity = amount;
			recompute_amp(&voice[i]);
			apply_envelope_to_amp(&voice[i]);
			if (!(voice[i].sample->self_nonexclusive))
			{
				return;
			}
		}
	}
}